

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O0

void __thiscall
wallet::wallet_tests::scan_for_wallet_transactions::test_method(scan_for_wallet_transactions *this)

{
  long lVar1;
  uint256 block_hash;
  uint256 block_hash_00;
  uint256 block_hash_01;
  uint256 block_hash_02;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  bool bVar2;
  CBlockIndex *pCVar3;
  lazy_ostream *plVar4;
  int *piVar5;
  lazy_ostream *plVar6;
  CWallet *this_00;
  pointer pCVar7;
  CWallet *pCVar8;
  long in_FS_OFFSET;
  ChainstateManager *in_stack_ffffffffffffd658;
  char *pcVar9;
  undefined4 uVar11;
  CBlockIndex *pCVar10;
  CBlockIndex *in_stack_ffffffffffffd668;
  undefined4 in_stack_ffffffffffffd678;
  undefined1 uVar12;
  int in_stack_ffffffffffffd67c;
  WalletRescanReserver *in_stack_ffffffffffffd680;
  undefined4 in_stack_ffffffffffffd688;
  int in_stack_ffffffffffffd68c;
  lazy_ostream *in_stack_ffffffffffffd690;
  Chainstate *in_stack_ffffffffffffd698;
  CWallet *pCVar13;
  undefined7 in_stack_ffffffffffffd6a0;
  undefined1 in_stack_ffffffffffffd6a7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffd6a8;
  TestChain100Setup *in_stack_ffffffffffffd6b0;
  undefined8 in_stack_ffffffffffffd6c0;
  undefined7 in_stack_ffffffffffffd6c8;
  undefined1 in_stack_ffffffffffffd6cf;
  undefined7 in_stack_ffffffffffffd6d8;
  undefined1 in_stack_ffffffffffffd6df;
  undefined8 in_stack_ffffffffffffd6e0;
  uint256 *puVar14;
  CWallet *in_stack_ffffffffffffd6e8;
  undefined8 in_stack_ffffffffffffd748;
  int fileNumber;
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
  *in_stack_ffffffffffffd768;
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *database;
  string *in_stack_ffffffffffffd770;
  string *name;
  Chain *in_stack_ffffffffffffd778;
  Chain *chain;
  CWallet *in_stack_ffffffffffffd780;
  undefined8 in_stack_ffffffffffffd8e8;
  undefined2 uVar15;
  WalletRescanReserver *in_stack_ffffffffffffd8f0;
  int in_stack_ffffffffffffd8fc;
  uint256 *in_stack_ffffffffffffd900;
  CWallet *in_stack_ffffffffffffd908;
  int file_number;
  CBlockIndex *newTip;
  scan_for_wallet_transactions *this_local;
  lazy_ostream local_2494;
  undefined1 local_2480 [8];
  _Optional_payload_base<int> in_stack_ffffffffffffdb88;
  undefined1 local_2460 [16];
  undefined1 local_2450 [64];
  const_string local_2410 [2];
  lazy_ostream local_23f0 [2];
  assertion_result local_23d0 [2];
  const_string local_2398 [2];
  lazy_ostream local_2378 [2];
  assertion_result local_2358 [2];
  undefined1 local_2320 [16];
  undefined1 local_2310 [68];
  lazy_ostream local_22cc;
  undefined1 local_22b8 [64];
  WalletRescanReserver reserver_3;
  undefined1 local_223b [3];
  CBlockIndex local_2238;
  undefined1 local_21a0 [64];
  undefined1 local_2160 [16];
  undefined1 local_2150 [64];
  undefined1 local_2110 [16];
  undefined1 local_2100 [68];
  undefined1 local_20bc [84];
  WalletRescanReserver reserver_2;
  allocator<char> local_202b [3];
  const_string local_2028 [2];
  lazy_ostream local_2008 [2];
  assertion_result local_1fe8 [2];
  const_string local_1fb0 [2];
  lazy_ostream local_1f90 [3];
  assertion_result local_1f60 [2];
  CBlockLocator locator_1;
  CBlockIndex local_1f10;
  undefined1 local_1e78 [64];
  undefined1 local_1e38 [16];
  undefined1 local_1e28 [64];
  const_string local_1de8 [2];
  lazy_ostream local_1dc8 [2];
  assertion_result local_1da8 [2];
  undefined1 local_1d6c [116];
  lazy_ostream local_1cf8 [2];
  assertion_result local_1cd8 [2];
  const_string local_1ca0 [2];
  lazy_ostream local_1c80 [3];
  assertion_result local_1c50 [2];
  CBlockLocator locator;
  time_point fake_time;
  WalletRescanReserver reserver_1;
  allocator<char> local_1b95;
  lazy_ostream local_1b94;
  undefined1 local_1b80 [32];
  undefined1 local_1b60 [16];
  undefined1 local_1b50 [64];
  const_string local_1b10 [2];
  lazy_ostream local_1af0 [2];
  assertion_result local_1ad0 [2];
  const_string local_1a98 [2];
  lazy_ostream local_1a78 [2];
  assertion_result local_1a58 [2];
  const_string local_1a20 [2];
  lazy_ostream local_1a00 [2];
  assertion_result local_19e0 [2];
  lazy_ostream local_19a4;
  undefined1 local_1990 [64];
  WalletRescanReserver reserver;
  allocator<char> local_1911;
  scan_for_wallet_transactions *local_1910;
  undefined8 local_1908;
  undefined8 uStack_1900;
  undefined8 local_18f8;
  scan_for_wallet_transactions *local_18e8;
  CBlockIndex **local_18e0;
  scan_for_wallet_transactions *local_18d8;
  CBlockIndex *oldTip;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock25;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock24;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock23;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock22;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock21;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock20;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock19;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock18;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock17;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock16;
  lazy_ostream local_17f4 [4];
  ScanResult result_3;
  WalletRescanReserver *local_1768;
  ulong uStack_1760;
  CWallet *local_1758;
  CWallet wallet_3;
  undefined1 local_1214 [96];
  ScanResult result_2;
  WalletRescanReserver *local_1168;
  ulong uStack_1160;
  CWallet *local_1158;
  CWallet wallet_2;
  undefined1 local_c14 [64];
  ScanResult result_1;
  WalletRescanReserver *local_b88;
  WalletDatabase *pWStack_b80;
  CWallet *local_b78;
  WalletBatch *pWStack_b70;
  CWallet wallet_1;
  ScanResult result;
  WalletRescanReserver *local_5f8;
  ulong uStack_5f0;
  CWallet *local_5e8;
  CWallet wallet;
  
  local_2008[0].m_empty = false;
  local_2008[0]._9_7_ = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_ffffffffffffd698,(char *)in_stack_ffffffffffffd690,in_stack_ffffffffffffd68c,
             (char *)in_stack_ffffffffffffd680,
             (char *)CONCAT44(in_stack_ffffffffffffd67c,in_stack_ffffffffffffd678));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_ffffffffffffd658);
  ChainstateManager::GetMutex(in_stack_ffffffffffffd658);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffd658);
  local_18d8 = this;
  oldTip = test_method::anon_class_8_1_8991fb9c::operator()
                     ((anon_class_8_1_8991fb9c *)in_stack_ffffffffffffd698);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffd658);
  local_18e0 = &oldTip;
  local_18e8 = this;
  test_method::anon_class_16_2_4c6564ef::operator()
            ((anon_class_16_2_4c6564ef *)in_stack_ffffffffffffd698);
  local_1908 = 0;
  uStack_1900 = 0;
  local_18f8 = 0;
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_ffffffffffffd658);
  CKey::GetPubKey((CKey *)in_stack_ffffffffffffd680);
  GetScriptForRawPubKey((CPubKey *)CONCAT17(in_stack_ffffffffffffd6a7,in_stack_ffffffffffffd6a0));
  TestChain100Setup::CreateAndProcessBlock
            (in_stack_ffffffffffffd6b0,
             (vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_ffffffffffffd6a8,
             (CScript *)CONCAT17(in_stack_ffffffffffffd6a7,in_stack_ffffffffffffd6a0),
             in_stack_ffffffffffffd698);
  CBlock::~CBlock((CBlock *)in_stack_ffffffffffffd658);
  CScript::~CScript((CScript *)in_stack_ffffffffffffd658);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_ffffffffffffd668);
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_ffffffffffffd698,(char *)in_stack_ffffffffffffd690,in_stack_ffffffffffffd68c,
             (char *)in_stack_ffffffffffffd680,
             (char *)CONCAT44(in_stack_ffffffffffffd67c,in_stack_ffffffffffffd678));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_ffffffffffffd658);
  ChainstateManager::GetMutex(in_stack_ffffffffffffd658);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffd658);
  local_1910 = this;
  pCVar3 = test_method::anon_class_8_1_8991fb9c::operator()
                     ((anon_class_8_1_8991fb9c *)in_stack_ffffffffffffd698);
  std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::get
            ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
             in_stack_ffffffffffffd658);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffd6a8,
             (char *)CONCAT17(in_stack_ffffffffffffd6a7,in_stack_ffffffffffffd6a0),
             (allocator<char> *)in_stack_ffffffffffffd698);
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
         *)in_stack_ffffffffffffd658);
  CreateMockableWalletDatabase((MockableData *)in_stack_ffffffffffffd668);
  CWallet::CWallet(in_stack_ffffffffffffd780,in_stack_ffffffffffffd778,in_stack_ffffffffffffd770,
                   in_stack_ffffffffffffd768);
  std::unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::~unique_ptr
            ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             in_stack_ffffffffffffd668);
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
          *)in_stack_ffffffffffffd658);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffd658);
  std::allocator<char>::~allocator(&local_1911);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffd658);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffd698,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffd690,
             (char *)CONCAT44(in_stack_ffffffffffffd68c,in_stack_ffffffffffffd688),
             (char *)in_stack_ffffffffffffd680,in_stack_ffffffffffffd67c,
             SUB41((uint)in_stack_ffffffffffffd678 >> 0x18,0));
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_ffffffffffffd698,(char *)in_stack_ffffffffffffd690,in_stack_ffffffffffffd68c,
             (char *)in_stack_ffffffffffffd680,
             (char *)CONCAT44(in_stack_ffffffffffffd67c,in_stack_ffffffffffffd678));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_ffffffffffffd658);
  ChainstateManager::GetMutex(in_stack_ffffffffffffd658);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffd658);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffd698,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffd690,
             (char *)CONCAT44(in_stack_ffffffffffffd68c,in_stack_ffffffffffffd688),
             (char *)in_stack_ffffffffffffd680,in_stack_ffffffffffffd67c,
             SUB41((uint)in_stack_ffffffffffffd678 >> 0x18,0));
  CWallet::SetWalletFlag
            ((CWallet *)CONCAT17(in_stack_ffffffffffffd6a7,in_stack_ffffffffffffd6a0),
             (uint64_t)in_stack_ffffffffffffd698);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_ffffffffffffd658);
  ChainstateManager::ActiveChain(in_stack_ffffffffffffd658);
  CChain::Height((CChain *)in_stack_ffffffffffffd658);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_ffffffffffffd658);
  ChainstateManager::ActiveChain(in_stack_ffffffffffffd658);
  CChain::Tip((CChain *)in_stack_ffffffffffffd668);
  CBlockIndex::GetBlockHash(in_stack_ffffffffffffd668);
  block_hash.super_base_blob<256U>.m_data._M_elems[8] = (char)in_stack_ffffffffffffd688;
  block_hash.super_base_blob<256U>.m_data._M_elems[9] = (char)((uint)in_stack_ffffffffffffd688 >> 8)
  ;
  block_hash.super_base_blob<256U>.m_data._M_elems[10] =
       (char)((uint)in_stack_ffffffffffffd688 >> 0x10);
  block_hash.super_base_blob<256U>.m_data._M_elems[0xb] =
       (char)((uint)in_stack_ffffffffffffd688 >> 0x18);
  block_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = in_stack_ffffffffffffd680;
  block_hash.super_base_blob<256U>.m_data._M_elems[0xc] = (char)in_stack_ffffffffffffd68c;
  block_hash.super_base_blob<256U>.m_data._M_elems[0xd] =
       (char)((uint)in_stack_ffffffffffffd68c >> 8);
  block_hash.super_base_blob<256U>.m_data._M_elems[0xe] =
       (char)((uint)in_stack_ffffffffffffd68c >> 0x10);
  block_hash.super_base_blob<256U>.m_data._M_elems[0xf] =
       (char)((uint)in_stack_ffffffffffffd68c >> 0x18);
  block_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = in_stack_ffffffffffffd690;
  block_hash.super_base_blob<256U>.m_data._M_elems._24_8_ = in_stack_ffffffffffffd698;
  CWallet::SetLastBlockProcessed(local_5e8,(int)(uStack_5f0 >> 0x20),block_hash);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)local_5f8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)local_5f8);
  AddKey((CWallet *)CONCAT17(in_stack_ffffffffffffd6a7,in_stack_ffffffffffffd6a0),
         (CKey *)in_stack_ffffffffffffd698);
  WalletRescanReserver::WalletRescanReserver(local_5f8,(CWallet *)0xe22d5e);
  WalletRescanReserver::reserve
            (in_stack_ffffffffffffd680,SUB41((uint)in_stack_ffffffffffffd67c >> 0x18,0));
  uint256::uint256((uint256 *)local_5f8);
  std::optional<int>::optional((optional<int> *)local_5f8);
  plVar4 = (lazy_ostream *)(uStack_5f0 & 0xffffffff00000000);
  pcVar9 = (char *)((ulong)local_5f8 & 0xffffffff00000000);
  CWallet::ScanForWalletTransactions
            (in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,in_stack_ffffffffffffd8fc,
             (optional<int>)in_stack_ffffffffffffdb88,in_stack_ffffffffffffd8f0,
             SUB81((ulong)in_stack_ffffffffffffd8e8 >> 0x38,0),
             SUB81((ulong)in_stack_ffffffffffffd8e8 >> 0x30,0));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_5e8,(pointer)plVar4,(unsigned_long)pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar9);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd698,
               (const_string *)in_stack_ffffffffffffd690,
               CONCAT44(in_stack_ffffffffffffd68c,in_stack_ffffffffffffd688),
               (const_string *)in_stack_ffffffffffffd680);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(plVar4,(char (*) [1])pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_5e8,(pointer)plVar4,(unsigned_long)pcVar9);
    local_19a4._vptr_lazy_ostream._0_4_ = 1;
    local_5e8 = (CWallet *)0x1ce54c0;
    plVar4 = &local_19a4;
    pcVar9 = "result.status";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,wallet::CWallet::ScanResult::_unnamed_type_1_,_unnamed_type_1_>
              (local_1990,(undefined1 *)((long)&local_19a4._vptr_lazy_ostream + 4),0x60,1,2,&result)
    ;
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_5e8,(pointer)plVar4,(unsigned_long)pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar9);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd698,
               (const_string *)in_stack_ffffffffffffd690,
               CONCAT44(in_stack_ffffffffffffd68c,in_stack_ffffffffffffd688),
               (const_string *)in_stack_ffffffffffffd680);
    base_blob<256U>::IsNull((base_blob<256U> *)local_5e8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)local_5e8,SUB81((ulong)plVar4 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_5e8,(pointer)plVar4,(unsigned_long)pcVar9);
    boost::unit_test::operator<<(plVar4,(basic_cstring<const_char> *)pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_5e8,(pointer)plVar4,(unsigned_long)pcVar9);
    pcVar9 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_19e0,local_1a00,local_1a20,0x61,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pcVar9);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_5e8,(pointer)plVar4,(unsigned_long)pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar9);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd698,
               (const_string *)in_stack_ffffffffffffd690,
               CONCAT44(in_stack_ffffffffffffd68c,in_stack_ffffffffffffd688),
               (const_string *)in_stack_ffffffffffffd680);
    base_blob<256U>::IsNull((base_blob<256U> *)local_5e8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)local_5e8,SUB81((ulong)plVar4 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_5e8,(pointer)plVar4,(unsigned_long)pcVar9);
    boost::unit_test::operator<<(plVar4,(basic_cstring<const_char> *)pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_5e8,(pointer)plVar4,(unsigned_long)pcVar9);
    pcVar9 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1a58,local_1a78,local_1a98,0x62,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pcVar9);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_5e8,(pointer)plVar4,(unsigned_long)pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar9);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd698,
               (const_string *)in_stack_ffffffffffffd690,
               CONCAT44(in_stack_ffffffffffffd68c,in_stack_ffffffffffffd688),
               (const_string *)in_stack_ffffffffffffd680);
    std::optional::operator_cast_to_bool((optional<int> *)pcVar9);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)local_5e8,SUB81((ulong)plVar4 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_5e8,(pointer)plVar4,(unsigned_long)pcVar9);
    boost::unit_test::operator<<(plVar4,(basic_cstring<const_char> *)pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_5e8,(pointer)plVar4,(unsigned_long)pcVar9);
    pcVar9 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1ad0,local_1af0,local_1b10,99,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pcVar9);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_5e8,(pointer)plVar4,(unsigned_long)pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar9);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd698,
               (const_string *)in_stack_ffffffffffffd690,
               CONCAT44(in_stack_ffffffffffffd68c,in_stack_ffffffffffffd688),
               (const_string *)in_stack_ffffffffffffd680);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(plVar4,(char (*) [1])pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_5e8,(pointer)plVar4,(unsigned_long)pcVar9);
    GetBalance(in_stack_ffffffffffffd6e8,(int)((ulong)in_stack_ffffffffffffd6e0 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffd6e0 >> 0x18,0));
    local_1b94._vptr_lazy_ostream._0_4_ = 0;
    local_5e8 = (CWallet *)0x1d1f9c0;
    plVar4 = &local_1b94;
    pcVar9 = "GetBalance(wallet).m_mine_immature";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_1b50,local_1b60,100,1,2,local_1b80);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  WalletRescanReserver::~WalletRescanReserver((WalletRescanReserver *)pcVar9);
  CWallet::~CWallet(local_5e8);
  std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::get
            ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)pcVar9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffd6a8,
             (char *)CONCAT17(in_stack_ffffffffffffd6a7,in_stack_ffffffffffffd6a0),
             (allocator<char> *)in_stack_ffffffffffffd698);
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
         *)pcVar9);
  CreateMockableWalletDatabase((MockableData *)local_5e8);
  CWallet::CWallet(in_stack_ffffffffffffd780,in_stack_ffffffffffffd778,in_stack_ffffffffffffd770,
                   in_stack_ffffffffffffd768);
  std::unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::~unique_ptr
            ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             local_5e8);
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
          *)pcVar9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar9);
  std::allocator<char>::~allocator(&local_1b95);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)pcVar9);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffd698,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffd690,
             (char *)CONCAT44(in_stack_ffffffffffffd68c,in_stack_ffffffffffffd688),
             (char *)in_stack_ffffffffffffd680,in_stack_ffffffffffffd67c,
             SUB41((uint)in_stack_ffffffffffffd678 >> 0x18,0));
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_ffffffffffffd698,(char *)in_stack_ffffffffffffd690,in_stack_ffffffffffffd68c,
             (char *)in_stack_ffffffffffffd680,
             (char *)CONCAT44(in_stack_ffffffffffffd67c,in_stack_ffffffffffffd678));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar9);
  ChainstateManager::GetMutex((ChainstateManager *)pcVar9);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)pcVar9);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffd698,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffd690,
             (char *)CONCAT44(in_stack_ffffffffffffd68c,in_stack_ffffffffffffd688),
             (char *)in_stack_ffffffffffffd680,in_stack_ffffffffffffd67c,
             SUB41((uint)in_stack_ffffffffffffd678 >> 0x18,0));
  CWallet::SetWalletFlag
            ((CWallet *)CONCAT17(in_stack_ffffffffffffd6a7,in_stack_ffffffffffffd6a0),
             (uint64_t)in_stack_ffffffffffffd698);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar9);
  ChainstateManager::ActiveChain((ChainstateManager *)pcVar9);
  CChain::Height((CChain *)pcVar9);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar9);
  ChainstateManager::ActiveChain((ChainstateManager *)pcVar9);
  CChain::Tip((CChain *)local_5e8);
  CBlockIndex::GetBlockHash((CBlockIndex *)local_5e8);
  block_hash_00.super_base_blob<256U>.m_data._M_elems[8] = (char)in_stack_ffffffffffffd688;
  block_hash_00.super_base_blob<256U>.m_data._M_elems[9] =
       (char)((uint)in_stack_ffffffffffffd688 >> 8);
  block_hash_00.super_base_blob<256U>.m_data._M_elems[10] =
       (char)((uint)in_stack_ffffffffffffd688 >> 0x10);
  block_hash_00.super_base_blob<256U>.m_data._M_elems[0xb] =
       (char)((uint)in_stack_ffffffffffffd688 >> 0x18);
  block_hash_00.super_base_blob<256U>.m_data._M_elems._0_8_ = in_stack_ffffffffffffd680;
  block_hash_00.super_base_blob<256U>.m_data._M_elems[0xc] = (char)in_stack_ffffffffffffd68c;
  block_hash_00.super_base_blob<256U>.m_data._M_elems[0xd] =
       (char)((uint)in_stack_ffffffffffffd68c >> 8);
  block_hash_00.super_base_blob<256U>.m_data._M_elems[0xe] =
       (char)((uint)in_stack_ffffffffffffd68c >> 0x10);
  block_hash_00.super_base_blob<256U>.m_data._M_elems[0xf] =
       (char)((uint)in_stack_ffffffffffffd68c >> 0x18);
  block_hash_00.super_base_blob<256U>.m_data._M_elems._16_8_ = in_stack_ffffffffffffd690;
  block_hash_00.super_base_blob<256U>.m_data._M_elems._24_8_ = in_stack_ffffffffffffd698;
  CWallet::SetLastBlockProcessed(local_b78,(int)((ulong)pWStack_b80 >> 0x20),block_hash_00);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)local_b88);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)local_b88);
  AddKey((CWallet *)CONCAT17(in_stack_ffffffffffffd6a7,in_stack_ffffffffffffd6a0),
         (CKey *)in_stack_ffffffffffffd698);
  WalletRescanReserver::WalletRescanReserver(local_b88,(CWallet *)0xe23791);
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)local_b88);
  std::
  function<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>()>
  ::function<wallet::wallet_tests::scan_for_wallet_transactions::test_method()::__0,void>
            ((function<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_()>
              *)local_b78,(anon_class_8_1_53340817 *)pWStack_b80);
  WalletRescanReserver::setNow(local_b88,(NowFn *)0xe237e4);
  std::
  function<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_()>
  ::~function((function<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_()>
               *)local_b88);
  WalletRescanReserver::reserve
            (in_stack_ffffffffffffd680,SUB41((uint)in_stack_ffffffffffffd67c >> 0x18,0));
  CBlockLocator::CBlockLocator((CBlockLocator *)local_b88);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_b78,(pointer)pWStack_b80,(unsigned_long)local_b88)
    ;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)local_b88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd698,
               (const_string *)in_stack_ffffffffffffd690,
               CONCAT44(in_stack_ffffffffffffd68c,in_stack_ffffffffffffd688),
               (const_string *)in_stack_ffffffffffffd680);
    CWallet::GetDatabase(local_b78);
    WalletBatch::WalletBatch((WalletBatch *)local_b78,pWStack_b80,SUB81((ulong)local_b88 >> 0x38,0))
    ;
    WalletBatch::ReadBestBlock(pWStack_b70,(CBlockLocator *)local_b78);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)local_b78,SUB81((ulong)pWStack_b80 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_b78,(pointer)pWStack_b80,(unsigned_long)local_b88)
    ;
    boost::unit_test::operator<<((lazy_ostream *)pWStack_b80,(basic_cstring<const_char> *)local_b88)
    ;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_b78,(pointer)pWStack_b80,(unsigned_long)local_b88)
    ;
    local_b88 = (WalletRescanReserver *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1c50,local_1c80,local_1ca0,0x79,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)local_b88);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)local_b88);
    WalletBatch::~WalletBatch((WalletBatch *)local_b88);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_b78,(pointer)pWStack_b80,(unsigned_long)local_b88)
    ;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)local_b88);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd698,
               (const_string *)in_stack_ffffffffffffd690,
               CONCAT44(in_stack_ffffffffffffd68c,in_stack_ffffffffffffd688),
               (const_string *)in_stack_ffffffffffffd680);
    CBlockLocator::IsNull((CBlockLocator *)local_b88);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)local_b78,SUB81((ulong)pWStack_b80 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_b78,(pointer)pWStack_b80,(unsigned_long)local_b88)
    ;
    boost::unit_test::operator<<((lazy_ostream *)pWStack_b80,(basic_cstring<const_char> *)local_b88)
    ;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_b78,(pointer)pWStack_b80,(unsigned_long)local_b88)
    ;
    local_b88 = (WalletRescanReserver *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1cd8,local_1cf8,(const_string *)(local_1d6c + 0x54),0x7a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)local_b88);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)local_b88);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
    uVar15 = (undefined2)((ulong)in_stack_ffffffffffffd8e8 >> 0x30);
  } while (bVar2);
  CBlockLocator::~CBlockLocator((CBlockLocator *)local_b88);
  uVar11 = (undefined4)((ulong)pWStack_b80 >> 0x20);
  CBlockIndex::GetBlockHash((CBlockIndex *)local_b78);
  std::optional<int>::optional((optional<int> *)local_b88);
  pCVar10 = (CBlockIndex *)CONCAT44(uVar11,1);
  pcVar9 = (char *)((ulong)local_b88 & 0xffffffff00000000);
  CWallet::ScanForWalletTransactions
            (in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,in_stack_ffffffffffffd8fc,
             (optional<int>)in_stack_ffffffffffffdb88,in_stack_ffffffffffffd8f0,
             SUB21((ushort)uVar15 >> 8,0),SUB21(uVar15,0));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_b78,(pointer)pCVar10,(unsigned_long)pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar9);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd698,
               (const_string *)in_stack_ffffffffffffd690,
               CONCAT44(in_stack_ffffffffffffd68c,in_stack_ffffffffffffd688),
               (const_string *)in_stack_ffffffffffffd680);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pCVar10,(char (*) [1])pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_b78,(pointer)pCVar10,(unsigned_long)pcVar9);
    local_1d6c._0_4_ = 0;
    local_b78 = (CWallet *)0x1cecc0f;
    pCVar10 = (CBlockIndex *)local_1d6c;
    pcVar9 = "result.status";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,wallet::CWallet::ScanResult::_unnamed_type_1_,_unnamed_type_1_>
              (local_1d6c + 0x14,local_1d6c + 4,0x7e,1,2,&result_1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_b78,(pointer)pCVar10,(unsigned_long)pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar9);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd698,
               (const_string *)in_stack_ffffffffffffd690,
               CONCAT44(in_stack_ffffffffffffd68c,in_stack_ffffffffffffd688),
               (const_string *)in_stack_ffffffffffffd680);
    base_blob<256U>::IsNull((base_blob<256U> *)local_b78);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)local_b78,SUB81((ulong)pCVar10 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_b78,(pointer)pCVar10,(unsigned_long)pcVar9);
    boost::unit_test::operator<<((lazy_ostream *)pCVar10,(basic_cstring<const_char> *)pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_b78,(pointer)pCVar10,(unsigned_long)pcVar9);
    pcVar9 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1da8,local_1dc8,local_1de8,0x7f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pcVar9);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_b78,(pointer)pCVar10,(unsigned_long)pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar9);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd698,
               (const_string *)in_stack_ffffffffffffd690,
               CONCAT44(in_stack_ffffffffffffd68c,in_stack_ffffffffffffd688),
               (const_string *)in_stack_ffffffffffffd680);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pCVar10,(char (*) [1])pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_b78,(pointer)pCVar10,(unsigned_long)pcVar9);
    CBlockIndex::GetBlockHash((CBlockIndex *)local_b78);
    local_b78 = (CWallet *)0x1ce55b5;
    pCVar10 = (CBlockIndex *)local_c14;
    pcVar9 = "result.last_scanned_block";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_1e28,local_1e38,0x80,1,2,&result_1.last_scanned_block);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    pCVar8 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_b78,(pointer)pCVar10,(unsigned_long)pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar9);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd698,
               (const_string *)in_stack_ffffffffffffd690,
               CONCAT44(in_stack_ffffffffffffd68c,in_stack_ffffffffffffd688),
               (const_string *)in_stack_ffffffffffffd680);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pCVar10,(char (*) [1])pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_b78,(pointer)pCVar10,(unsigned_long)pcVar9);
    piVar5 = std::optional<int>::operator*((optional<int> *)pcVar9);
    pCVar10 = (CBlockIndex *)&pCVar3->nHeight;
    local_b78 = (CWallet *)0x1ce55e8;
    pcVar9 = "*result.last_scanned_height";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_1e78,&local_1f10.nNonce,0x81,1,2,piVar5);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
    in_stack_ffffffffffffd8fc = CONCAT13(bVar2,(int3)in_stack_ffffffffffffd8fc);
  } while (bVar2);
  do {
    pCVar13 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_b78,(pointer)pCVar10,(unsigned_long)pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar9);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd698,
               (const_string *)in_stack_ffffffffffffd690,
               CONCAT44(in_stack_ffffffffffffd68c,in_stack_ffffffffffffd688),
               (const_string *)in_stack_ffffffffffffd680);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pCVar10,(char (*) [1])pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_b78,(pointer)pCVar10,(unsigned_long)pcVar9);
    GetBalance(in_stack_ffffffffffffd6e8,(int)((ulong)in_stack_ffffffffffffd6e0 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffd6e0 >> 0x18,0));
    local_1f10.phashBlock = (uint256 *)0x2540be400;
    local_b78 = (CWallet *)0x1ce55f8;
    pCVar10 = &local_1f10;
    pcVar9 = "GetBalance(wallet).m_mine_immature";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&local_1f10.nTx,local_1f10.nChainWork.super_base_uint<256U>.pn + 4,0x82,1,2,
               &local_1f10.nHeight);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CBlockLocator::CBlockLocator((CBlockLocator *)pcVar9);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_b78,(pointer)pCVar10,(unsigned_long)pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar9);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd698,
               (const_string *)in_stack_ffffffffffffd690,
               CONCAT44(in_stack_ffffffffffffd68c,in_stack_ffffffffffffd688),
               (const_string *)in_stack_ffffffffffffd680);
    CWallet::GetDatabase(local_b78);
    WalletBatch::WalletBatch
              ((WalletBatch *)local_b78,(WalletDatabase *)pCVar10,SUB81((ulong)pcVar9 >> 0x38,0));
    WalletBatch::ReadBestBlock(pWStack_b70,(CBlockLocator *)local_b78);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)local_b78,SUB81((ulong)pCVar10 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_b78,(pointer)pCVar10,(unsigned_long)pcVar9);
    boost::unit_test::operator<<((lazy_ostream *)pCVar10,(basic_cstring<const_char> *)pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_b78,(pointer)pCVar10,(unsigned_long)pcVar9);
    pcVar9 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1f60,local_1f90,local_1fb0,0x86,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pcVar9);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar9);
    WalletBatch::~WalletBatch((WalletBatch *)pcVar9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_b78,(pointer)pCVar10,(unsigned_long)pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar9);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd698,
               (const_string *)in_stack_ffffffffffffd690,
               CONCAT44(in_stack_ffffffffffffd68c,in_stack_ffffffffffffd688),
               (const_string *)in_stack_ffffffffffffd680);
    CBlockLocator::IsNull((CBlockLocator *)pcVar9);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)local_b78,SUB81((ulong)pCVar10 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_b78,(pointer)pCVar10,(unsigned_long)pcVar9);
    boost::unit_test::operator<<((lazy_ostream *)pCVar10,(basic_cstring<const_char> *)pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_b78,(pointer)pCVar10,(unsigned_long)pcVar9);
    pcVar9 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1fe8,local_2008,local_2028,0x87,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pcVar9);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CBlockLocator::~CBlockLocator((CBlockLocator *)pcVar9);
  WalletRescanReserver::~WalletRescanReserver((WalletRescanReserver *)pcVar9);
  CWallet::~CWallet(local_b78);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)pcVar9);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffd698,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffd690,
             (char *)CONCAT44(in_stack_ffffffffffffd68c,in_stack_ffffffffffffd688),
             (char *)in_stack_ffffffffffffd680,in_stack_ffffffffffffd67c,
             SUB41((uint)in_stack_ffffffffffffd678 >> 0x18,0));
  CBlockIndex::GetBlockPos(pCVar10);
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_ffffffffffffd698,(char *)in_stack_ffffffffffffd690,in_stack_ffffffffffffd68c,
             (char *)in_stack_ffffffffffffd680,
             (char *)CONCAT44(in_stack_ffffffffffffd67c,in_stack_ffffffffffffd678));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar9);
  ::node::BlockManager::PruneOneBlockFile
            ((BlockManager *)CONCAT17(in_stack_ffffffffffffd6df,in_stack_ffffffffffffd6d8),
             (int)((ulong)in_stack_ffffffffffffd748 >> 0x20));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)pcVar9);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar9);
  std::allocator<int>::allocator((allocator<int> *)pcVar9);
  __l._M_len._0_7_ = in_stack_ffffffffffffd6c8;
  __l._M_array = (iterator)in_stack_ffffffffffffd6c0;
  __l._M_len._7_1_ = in_stack_ffffffffffffd6cf;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffd6b0,__l,
             (less<int> *)in_stack_ffffffffffffd6a8,
             (allocator_type *)CONCAT17(in_stack_ffffffffffffd6a7,in_stack_ffffffffffffd6a0));
  ::node::BlockManager::UnlinkPrunedFiles
            ((BlockManager *)CONCAT17(in_stack_ffffffffffffd6a7,in_stack_ffffffffffffd6a0),
             (set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffd698);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)pcVar9);
  std::allocator<int>::~allocator((allocator<int> *)pcVar9);
  std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::get
            ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)pcVar9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffd6a8,
             (char *)CONCAT17(in_stack_ffffffffffffd6a7,in_stack_ffffffffffffd6a0),
             (allocator<char> *)in_stack_ffffffffffffd698);
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
         *)pcVar9);
  CreateMockableWalletDatabase((MockableData *)local_b78);
  CWallet::CWallet(in_stack_ffffffffffffd780,in_stack_ffffffffffffd778,in_stack_ffffffffffffd770,
                   in_stack_ffffffffffffd768);
  std::unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::~unique_ptr
            ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             local_b78);
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
          *)pcVar9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar9);
  std::allocator<char>::~allocator(local_202b);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)pcVar9);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffd698,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffd690,
             (char *)CONCAT44(in_stack_ffffffffffffd68c,in_stack_ffffffffffffd688),
             (char *)in_stack_ffffffffffffd680,in_stack_ffffffffffffd67c,
             SUB41((uint)in_stack_ffffffffffffd678 >> 0x18,0));
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_ffffffffffffd698,(char *)in_stack_ffffffffffffd690,in_stack_ffffffffffffd68c,
             (char *)in_stack_ffffffffffffd680,
             (char *)CONCAT44(in_stack_ffffffffffffd67c,in_stack_ffffffffffffd678));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar9);
  ChainstateManager::GetMutex((ChainstateManager *)pcVar9);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)pcVar9);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffd698,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffd690,
             (char *)CONCAT44(in_stack_ffffffffffffd68c,in_stack_ffffffffffffd688),
             (char *)in_stack_ffffffffffffd680,in_stack_ffffffffffffd67c,
             SUB41((uint)in_stack_ffffffffffffd678 >> 0x18,0));
  CWallet::SetWalletFlag
            ((CWallet *)CONCAT17(in_stack_ffffffffffffd6a7,in_stack_ffffffffffffd6a0),
             (uint64_t)in_stack_ffffffffffffd698);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar9);
  ChainstateManager::ActiveChain((ChainstateManager *)pcVar9);
  CChain::Height((CChain *)pcVar9);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar9);
  ChainstateManager::ActiveChain((ChainstateManager *)pcVar9);
  CChain::Tip((CChain *)local_b78);
  CBlockIndex::GetBlockHash((CBlockIndex *)local_b78);
  block_hash_01.super_base_blob<256U>.m_data._M_elems[8] = (char)in_stack_ffffffffffffd688;
  block_hash_01.super_base_blob<256U>.m_data._M_elems[9] =
       (char)((uint)in_stack_ffffffffffffd688 >> 8);
  block_hash_01.super_base_blob<256U>.m_data._M_elems[10] =
       (char)((uint)in_stack_ffffffffffffd688 >> 0x10);
  block_hash_01.super_base_blob<256U>.m_data._M_elems[0xb] =
       (char)((uint)in_stack_ffffffffffffd688 >> 0x18);
  block_hash_01.super_base_blob<256U>.m_data._M_elems._0_8_ = in_stack_ffffffffffffd680;
  block_hash_01.super_base_blob<256U>.m_data._M_elems[0xc] = (char)in_stack_ffffffffffffd68c;
  block_hash_01.super_base_blob<256U>.m_data._M_elems[0xd] =
       (char)((uint)in_stack_ffffffffffffd68c >> 8);
  block_hash_01.super_base_blob<256U>.m_data._M_elems[0xe] =
       (char)((uint)in_stack_ffffffffffffd68c >> 0x10);
  block_hash_01.super_base_blob<256U>.m_data._M_elems[0xf] =
       (char)((uint)in_stack_ffffffffffffd68c >> 0x18);
  block_hash_01.super_base_blob<256U>.m_data._M_elems._16_8_ = in_stack_ffffffffffffd690;
  block_hash_01.super_base_blob<256U>.m_data._M_elems._24_8_ = in_stack_ffffffffffffd698;
  CWallet::SetLastBlockProcessed(local_1158,(int)(uStack_1160 >> 0x20),block_hash_01);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)local_1168);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)local_1168);
  AddKey((CWallet *)CONCAT17(in_stack_ffffffffffffd6a7,in_stack_ffffffffffffd6a0),
         (CKey *)in_stack_ffffffffffffd698);
  WalletRescanReserver::WalletRescanReserver(local_1168,(CWallet *)0xe249e8);
  WalletRescanReserver::reserve
            (in_stack_ffffffffffffd680,SUB41((uint)in_stack_ffffffffffffd67c >> 0x18,0));
  CBlockIndex::GetBlockHash((CBlockIndex *)local_1158);
  std::optional<int>::optional((optional<int> *)local_1168);
  pCVar10 = (CBlockIndex *)(uStack_1160 & 0xffffffff00000000);
  pcVar9 = (char *)((ulong)local_1168 & 0xffffffff00000000);
  CWallet::ScanForWalletTransactions
            (pCVar8,(uint256 *)plVar4,in_stack_ffffffffffffd8fc,
             (optional<int>)in_stack_ffffffffffffdb88,(WalletRescanReserver *)pCVar13,
             SUB81((ulong)plVar6 >> 0x38,0),SUB81((ulong)plVar6 >> 0x30,0));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_1158,(pointer)pCVar10,(unsigned_long)pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar9);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd698,
               (const_string *)in_stack_ffffffffffffd690,
               CONCAT44(in_stack_ffffffffffffd68c,in_stack_ffffffffffffd688),
               (const_string *)in_stack_ffffffffffffd680);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pCVar10,(char (*) [1])pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_1158,(pointer)pCVar10,(unsigned_long)pcVar9);
    local_20bc._0_4_ = 1;
    local_1158 = (CWallet *)0x1ce54c0;
    pCVar10 = (CBlockIndex *)local_20bc;
    pcVar9 = "result.status";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,wallet::CWallet::ScanResult::_unnamed_type_1_,_unnamed_type_1_>
              (local_20bc + 0x14,local_20bc + 4,0xa2,1,2,&result_2);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_1158,(pointer)pCVar10,(unsigned_long)pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar9);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd698,
               (const_string *)in_stack_ffffffffffffd690,
               CONCAT44(in_stack_ffffffffffffd68c,in_stack_ffffffffffffd688),
               (const_string *)in_stack_ffffffffffffd680);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pCVar10,(char (*) [1])pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_1158,(pointer)pCVar10,(unsigned_long)pcVar9);
    CBlockIndex::GetBlockHash((CBlockIndex *)local_1158);
    local_1158 = (CWallet *)0x1ce562e;
    pCVar10 = (CBlockIndex *)(local_1214 + 0x20);
    pcVar9 = "result.last_failed_block";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_2100,local_2110,0xa3,1,2,&result_2.last_failed_block);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_1158,(pointer)pCVar10,(unsigned_long)pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar9);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd698,
               (const_string *)in_stack_ffffffffffffd690,
               CONCAT44(in_stack_ffffffffffffd68c,in_stack_ffffffffffffd688),
               (const_string *)in_stack_ffffffffffffd680);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pCVar10,(char (*) [1])pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_1158,(pointer)pCVar10,(unsigned_long)pcVar9);
    CBlockIndex::GetBlockHash((CBlockIndex *)local_1158);
    local_1158 = (CWallet *)0x1ce55b5;
    pCVar10 = (CBlockIndex *)local_1214;
    pcVar9 = "result.last_scanned_block";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_2150,local_2160,0xa4,1,2,&result_2.last_scanned_block);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_1158,(pointer)pCVar10,(unsigned_long)pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar9);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd698,
               (const_string *)in_stack_ffffffffffffd690,
               CONCAT44(in_stack_ffffffffffffd68c,in_stack_ffffffffffffd688),
               (const_string *)in_stack_ffffffffffffd680);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pCVar10,(char (*) [1])pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_1158,(pointer)pCVar10,(unsigned_long)pcVar9);
    piVar5 = std::optional<int>::operator*((optional<int> *)pcVar9);
    pCVar10 = (CBlockIndex *)&pCVar3->nHeight;
    local_1158 = (CWallet *)0x1ce55e8;
    pcVar9 = "*result.last_scanned_height";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_21a0,&local_2238.nNonce,0xa5,1,2,piVar5);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_1158,(pointer)pCVar10,(unsigned_long)pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar9);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd698,
               (const_string *)in_stack_ffffffffffffd690,
               CONCAT44(in_stack_ffffffffffffd68c,in_stack_ffffffffffffd688),
               (const_string *)in_stack_ffffffffffffd680);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)pCVar10,(char (*) [1])pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_1158,(pointer)pCVar10,(unsigned_long)pcVar9);
    GetBalance(in_stack_ffffffffffffd6e8,(int)((ulong)in_stack_ffffffffffffd6e0 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffd6e0 >> 0x18,0));
    local_2238.phashBlock = (uint256 *)0x12a05f200;
    local_1158 = (CWallet *)0x1cd7aa3;
    pCVar10 = &local_2238;
    pcVar9 = "GetBalance(wallet).m_mine_immature";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&local_2238.nTx,local_2238.nChainWork.super_base_uint<256U>.pn + 4,0xa6,1,2,
               &local_2238.nHeight);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
    uVar15 = (undefined2)((ulong)plVar6 >> 0x30);
    fileNumber = (int)((ulong)in_stack_ffffffffffffd748 >> 0x20);
  } while (bVar2);
  WalletRescanReserver::~WalletRescanReserver((WalletRescanReserver *)pcVar9);
  CWallet::~CWallet(local_1158);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)pcVar9);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffd698,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffd690,
             (char *)CONCAT44(in_stack_ffffffffffffd68c,in_stack_ffffffffffffd688),
             (char *)in_stack_ffffffffffffd680,in_stack_ffffffffffffd67c,
             SUB41((uint)in_stack_ffffffffffffd678 >> 0x18,0));
  CBlockIndex::GetBlockPos(pCVar10);
  this_00 = (CWallet *)
            inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                      ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
                       in_stack_ffffffffffffd698,(char *)in_stack_ffffffffffffd690,
                       in_stack_ffffffffffffd68c,(char *)in_stack_ffffffffffffd680,
                       (char *)CONCAT44(in_stack_ffffffffffffd67c,in_stack_ffffffffffffd678));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar9);
  ::node::BlockManager::PruneOneBlockFile
            ((BlockManager *)CONCAT17(in_stack_ffffffffffffd6df,in_stack_ffffffffffffd6d8),
             fileNumber);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)pcVar9);
  pCVar7 = std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
                     ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
                      pcVar9);
  name = (string *)&pCVar7->m_blockman;
  chain = (Chain *)(local_223b + 1);
  std::allocator<int>::allocator((allocator<int> *)pcVar9);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffd6c8;
  __l_00._M_array = (iterator)in_stack_ffffffffffffd6c0;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffd6cf;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffd6b0,__l_00,
             (less<int> *)in_stack_ffffffffffffd6a8,
             (allocator_type *)CONCAT17(in_stack_ffffffffffffd6a7,in_stack_ffffffffffffd6a0));
  ::node::BlockManager::UnlinkPrunedFiles
            ((BlockManager *)CONCAT17(in_stack_ffffffffffffd6a7,in_stack_ffffffffffffd6a0),
             (set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_ffffffffffffd698);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)pcVar9);
  std::allocator<int>::~allocator((allocator<int> *)pcVar9);
  std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::get
            ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)pcVar9);
  database = (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             local_223b;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffd6a8,
             (char *)CONCAT17(in_stack_ffffffffffffd6a7,in_stack_ffffffffffffd6a0),
             (allocator<char> *)in_stack_ffffffffffffd698);
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
         *)pcVar9);
  CreateMockableWalletDatabase((MockableData *)local_1158);
  CWallet::CWallet(this_00,chain,name,database);
  std::unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::~unique_ptr
            ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             local_1158);
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
          *)pcVar9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar9);
  std::allocator<char>::~allocator((allocator<char> *)local_223b);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)pcVar9);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffd698,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffd690,
             (char *)CONCAT44(in_stack_ffffffffffffd68c,in_stack_ffffffffffffd688),
             (char *)in_stack_ffffffffffffd680,in_stack_ffffffffffffd67c,
             SUB41((uint)in_stack_ffffffffffffd678 >> 0x18,0));
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_ffffffffffffd698,(char *)in_stack_ffffffffffffd690,in_stack_ffffffffffffd68c,
             (char *)in_stack_ffffffffffffd680,
             (char *)CONCAT44(in_stack_ffffffffffffd67c,in_stack_ffffffffffffd678));
  uVar12 = (undefined1)((uint)in_stack_ffffffffffffd678 >> 0x18);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar9);
  ChainstateManager::GetMutex((ChainstateManager *)pcVar9);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)pcVar9);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffd698,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffd690,
             (char *)CONCAT44(in_stack_ffffffffffffd68c,in_stack_ffffffffffffd688),
             (char *)in_stack_ffffffffffffd680,in_stack_ffffffffffffd67c,(bool)uVar12);
  uVar12 = (undefined1)((uint)in_stack_ffffffffffffd67c >> 0x18);
  CWallet::SetWalletFlag
            ((CWallet *)CONCAT17(in_stack_ffffffffffffd6a7,in_stack_ffffffffffffd6a0),
             (uint64_t)in_stack_ffffffffffffd698);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar9);
  ChainstateManager::ActiveChain((ChainstateManager *)pcVar9);
  CChain::Height((CChain *)pcVar9);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar9);
  ChainstateManager::ActiveChain((ChainstateManager *)pcVar9);
  CChain::Tip((CChain *)local_1158);
  CBlockIndex::GetBlockHash((CBlockIndex *)local_1158);
  block_hash_02.super_base_blob<256U>.m_data._M_elems[8] = (char)in_stack_ffffffffffffd688;
  block_hash_02.super_base_blob<256U>.m_data._M_elems[9] =
       (char)((uint)in_stack_ffffffffffffd688 >> 8);
  block_hash_02.super_base_blob<256U>.m_data._M_elems[10] =
       (char)((uint)in_stack_ffffffffffffd688 >> 0x10);
  block_hash_02.super_base_blob<256U>.m_data._M_elems[0xb] =
       (char)((uint)in_stack_ffffffffffffd688 >> 0x18);
  block_hash_02.super_base_blob<256U>.m_data._M_elems._0_8_ = in_stack_ffffffffffffd680;
  block_hash_02.super_base_blob<256U>.m_data._M_elems[0xc] = (char)in_stack_ffffffffffffd68c;
  block_hash_02.super_base_blob<256U>.m_data._M_elems[0xd] =
       (char)((uint)in_stack_ffffffffffffd68c >> 8);
  block_hash_02.super_base_blob<256U>.m_data._M_elems[0xe] =
       (char)((uint)in_stack_ffffffffffffd68c >> 0x10);
  block_hash_02.super_base_blob<256U>.m_data._M_elems[0xf] =
       (char)((uint)in_stack_ffffffffffffd68c >> 0x18);
  block_hash_02.super_base_blob<256U>.m_data._M_elems._16_8_ = in_stack_ffffffffffffd690;
  block_hash_02.super_base_blob<256U>.m_data._M_elems._24_8_ = in_stack_ffffffffffffd698;
  CWallet::SetLastBlockProcessed(local_1758,(int)(uStack_1760 >> 0x20),block_hash_02);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)local_1768);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)local_1768);
  AddKey((CWallet *)CONCAT17(in_stack_ffffffffffffd6a7,in_stack_ffffffffffffd6a0),
         (CKey *)in_stack_ffffffffffffd698);
  WalletRescanReserver::WalletRescanReserver(local_1768,(CWallet *)0xe25560);
  WalletRescanReserver::reserve(in_stack_ffffffffffffd680,(bool)uVar12);
  CBlockIndex::GetBlockHash((CBlockIndex *)local_1758);
  std::optional<int>::optional((optional<int> *)local_1768);
  plVar6 = (lazy_ostream *)(uStack_1760 & 0xffffffff00000000);
  pcVar9 = (char *)((ulong)local_1768 & 0xffffffff00000000);
  CWallet::ScanForWalletTransactions
            (pCVar8,(uint256 *)plVar4,in_stack_ffffffffffffd8fc,
             (optional<int>)in_stack_ffffffffffffdb88,(WalletRescanReserver *)pCVar13,
             SUB21((ushort)uVar15 >> 8,0),SUB21(uVar15,0));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_1758,(pointer)plVar6,(unsigned_long)pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar9);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd698,
               (const_string *)in_stack_ffffffffffffd690,
               CONCAT44(in_stack_ffffffffffffd68c,in_stack_ffffffffffffd688),
               (const_string *)in_stack_ffffffffffffd680);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(plVar6,(char (*) [1])pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_1758,(pointer)plVar6,(unsigned_long)pcVar9);
    local_22cc._vptr_lazy_ostream._0_4_ = 1;
    local_1758 = (CWallet *)0x1ce54c0;
    plVar6 = &local_22cc;
    pcVar9 = "result.status";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,wallet::CWallet::ScanResult::_unnamed_type_1_,_unnamed_type_1_>
              (local_22b8,(undefined1 *)((long)&local_22cc._vptr_lazy_ostream + 4),0xbe,1,2,
               &result_3);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_1758,(pointer)plVar6,(unsigned_long)pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar9);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd698,
               (const_string *)in_stack_ffffffffffffd690,
               CONCAT44(in_stack_ffffffffffffd68c,in_stack_ffffffffffffd688),
               (const_string *)in_stack_ffffffffffffd680);
    pCVar8 = (CWallet *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(plVar6,(char (*) [1])pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_1758,(pointer)plVar6,(unsigned_long)pcVar9);
    puVar14 = &result_3.last_failed_block;
    CBlockIndex::GetBlockHash((CBlockIndex *)local_1758);
    local_1758 = (CWallet *)0x1ce55b5;
    plVar6 = local_17f4;
    pcVar9 = "result.last_failed_block";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_2310,local_2320,0xbf,1,2,puVar14);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_1758,(pointer)plVar6,(unsigned_long)pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar9);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd698,
               (const_string *)in_stack_ffffffffffffd690,
               CONCAT44(in_stack_ffffffffffffd68c,in_stack_ffffffffffffd688),
               (const_string *)in_stack_ffffffffffffd680);
    base_blob<256U>::IsNull((base_blob<256U> *)local_1758);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)local_1758,SUB81((ulong)plVar6 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_1758,(pointer)plVar6,(unsigned_long)pcVar9);
    boost::unit_test::operator<<(plVar6,(basic_cstring<const_char> *)pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_1758,(pointer)plVar6,(unsigned_long)pcVar9);
    pcVar9 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2358,local_2378,local_2398,0xc0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pcVar9);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_1758,(pointer)plVar6,(unsigned_long)pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar9);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffd698,
               (const_string *)in_stack_ffffffffffffd690,
               CONCAT44(in_stack_ffffffffffffd68c,in_stack_ffffffffffffd688),
               (const_string *)in_stack_ffffffffffffd680);
    std::optional::operator_cast_to_bool((optional<int> *)pcVar9);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)local_1758,SUB81((ulong)plVar6 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_1758,(pointer)plVar6,(unsigned_long)pcVar9);
    boost::unit_test::operator<<(plVar6,(basic_cstring<const_char> *)pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_1758,(pointer)plVar6,(unsigned_long)pcVar9);
    pcVar9 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_23d0,local_23f0,local_2410,0xc1,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pcVar9);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    pCVar13 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_1758,(pointer)plVar6,(unsigned_long)pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar9);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)pCVar13,(const_string *)in_stack_ffffffffffffd690,
               CONCAT44(in_stack_ffffffffffffd68c,in_stack_ffffffffffffd688),
               (const_string *)in_stack_ffffffffffffd680);
    in_stack_ffffffffffffd690 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(plVar6,(char (*) [1])pcVar9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)local_1758,(pointer)plVar6,(unsigned_long)pcVar9);
    GetBalance(pCVar8,(int)((ulong)puVar14 >> 0x20),SUB81((ulong)puVar14 >> 0x18,0));
    local_2494._vptr_lazy_ostream._0_4_ = 0;
    local_1758 = (CWallet *)0x1d1f9c0;
    plVar6 = &local_2494;
    pcVar9 = "GetBalance(wallet).m_mine_immature";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_2450,local_2460,0xc2,1,2,local_2480);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
    in_stack_ffffffffffffd68c = CONCAT13(bVar2,(int3)in_stack_ffffffffffffd68c);
  } while (bVar2);
  WalletRescanReserver::~WalletRescanReserver((WalletRescanReserver *)pcVar9);
  CWallet::~CWallet(local_1758);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(scan_for_wallet_transactions, TestChain100Setup)
{
    // Cap last block file size, and mine new block in a new block file.
    CBlockIndex* oldTip = WITH_LOCK(Assert(m_node.chainman)->GetMutex(), return m_node.chainman->ActiveChain().Tip());
    WITH_LOCK(::cs_main, m_node.chainman->m_blockman.GetBlockFileInfo(oldTip->GetBlockPos().nFile)->nSize = MAX_BLOCKFILE_SIZE);
    CreateAndProcessBlock({}, GetScriptForRawPubKey(coinbaseKey.GetPubKey()));
    CBlockIndex* newTip = WITH_LOCK(Assert(m_node.chainman)->GetMutex(), return m_node.chainman->ActiveChain().Tip());

    // Verify ScanForWalletTransactions fails to read an unknown start block.
    {
        CWallet wallet(m_node.chain.get(), "", CreateMockableWalletDatabase());
        {
            LOCK(wallet.cs_wallet);
            LOCK(Assert(m_node.chainman)->GetMutex());
            wallet.SetWalletFlag(WALLET_FLAG_DESCRIPTORS);
            wallet.SetLastBlockProcessed(m_node.chainman->ActiveChain().Height(), m_node.chainman->ActiveChain().Tip()->GetBlockHash());
        }
        AddKey(wallet, coinbaseKey);
        WalletRescanReserver reserver(wallet);
        reserver.reserve();
        CWallet::ScanResult result = wallet.ScanForWalletTransactions(/*start_block=*/{}, /*start_height=*/0, /*max_height=*/{}, reserver, /*fUpdate=*/false, /*save_progress=*/false);
        BOOST_CHECK_EQUAL(result.status, CWallet::ScanResult::FAILURE);
        BOOST_CHECK(result.last_failed_block.IsNull());
        BOOST_CHECK(result.last_scanned_block.IsNull());
        BOOST_CHECK(!result.last_scanned_height);
        BOOST_CHECK_EQUAL(GetBalance(wallet).m_mine_immature, 0);
    }

    // Verify ScanForWalletTransactions picks up transactions in both the old
    // and new block files.
    {
        CWallet wallet(m_node.chain.get(), "", CreateMockableWalletDatabase());
        {
            LOCK(wallet.cs_wallet);
            LOCK(Assert(m_node.chainman)->GetMutex());
            wallet.SetWalletFlag(WALLET_FLAG_DESCRIPTORS);
            wallet.SetLastBlockProcessed(m_node.chainman->ActiveChain().Height(), m_node.chainman->ActiveChain().Tip()->GetBlockHash());
        }
        AddKey(wallet, coinbaseKey);
        WalletRescanReserver reserver(wallet);
        std::chrono::steady_clock::time_point fake_time;
        reserver.setNow([&] { fake_time += 60s; return fake_time; });
        reserver.reserve();

        {
            CBlockLocator locator;
            BOOST_CHECK(!WalletBatch{wallet.GetDatabase()}.ReadBestBlock(locator));
            BOOST_CHECK(locator.IsNull());
        }

        CWallet::ScanResult result = wallet.ScanForWalletTransactions(/*start_block=*/oldTip->GetBlockHash(), /*start_height=*/oldTip->nHeight, /*max_height=*/{}, reserver, /*fUpdate=*/false, /*save_progress=*/true);
        BOOST_CHECK_EQUAL(result.status, CWallet::ScanResult::SUCCESS);
        BOOST_CHECK(result.last_failed_block.IsNull());
        BOOST_CHECK_EQUAL(result.last_scanned_block, newTip->GetBlockHash());
        BOOST_CHECK_EQUAL(*result.last_scanned_height, newTip->nHeight);
        BOOST_CHECK_EQUAL(GetBalance(wallet).m_mine_immature, 100 * COIN);

        {
            CBlockLocator locator;
            BOOST_CHECK(WalletBatch{wallet.GetDatabase()}.ReadBestBlock(locator));
            BOOST_CHECK(!locator.IsNull());
        }
    }

    // Prune the older block file.
    int file_number;
    {
        LOCK(cs_main);
        file_number = oldTip->GetBlockPos().nFile;
        Assert(m_node.chainman)->m_blockman.PruneOneBlockFile(file_number);
    }
    m_node.chainman->m_blockman.UnlinkPrunedFiles({file_number});

    // Verify ScanForWalletTransactions only picks transactions in the new block
    // file.
    {
        CWallet wallet(m_node.chain.get(), "", CreateMockableWalletDatabase());
        {
            LOCK(wallet.cs_wallet);
            LOCK(Assert(m_node.chainman)->GetMutex());
            wallet.SetWalletFlag(WALLET_FLAG_DESCRIPTORS);
            wallet.SetLastBlockProcessed(m_node.chainman->ActiveChain().Height(), m_node.chainman->ActiveChain().Tip()->GetBlockHash());
        }
        AddKey(wallet, coinbaseKey);
        WalletRescanReserver reserver(wallet);
        reserver.reserve();
        CWallet::ScanResult result = wallet.ScanForWalletTransactions(/*start_block=*/oldTip->GetBlockHash(), /*start_height=*/oldTip->nHeight, /*max_height=*/{}, reserver, /*fUpdate=*/false, /*save_progress=*/false);
        BOOST_CHECK_EQUAL(result.status, CWallet::ScanResult::FAILURE);
        BOOST_CHECK_EQUAL(result.last_failed_block, oldTip->GetBlockHash());
        BOOST_CHECK_EQUAL(result.last_scanned_block, newTip->GetBlockHash());
        BOOST_CHECK_EQUAL(*result.last_scanned_height, newTip->nHeight);
        BOOST_CHECK_EQUAL(GetBalance(wallet).m_mine_immature, 50 * COIN);
    }

    // Prune the remaining block file.
    {
        LOCK(cs_main);
        file_number = newTip->GetBlockPos().nFile;
        Assert(m_node.chainman)->m_blockman.PruneOneBlockFile(file_number);
    }
    m_node.chainman->m_blockman.UnlinkPrunedFiles({file_number});

    // Verify ScanForWalletTransactions scans no blocks.
    {
        CWallet wallet(m_node.chain.get(), "", CreateMockableWalletDatabase());
        {
            LOCK(wallet.cs_wallet);
            LOCK(Assert(m_node.chainman)->GetMutex());
            wallet.SetWalletFlag(WALLET_FLAG_DESCRIPTORS);
            wallet.SetLastBlockProcessed(m_node.chainman->ActiveChain().Height(), m_node.chainman->ActiveChain().Tip()->GetBlockHash());
        }
        AddKey(wallet, coinbaseKey);
        WalletRescanReserver reserver(wallet);
        reserver.reserve();
        CWallet::ScanResult result = wallet.ScanForWalletTransactions(/*start_block=*/oldTip->GetBlockHash(), /*start_height=*/oldTip->nHeight, /*max_height=*/{}, reserver, /*fUpdate=*/false, /*save_progress=*/false);
        BOOST_CHECK_EQUAL(result.status, CWallet::ScanResult::FAILURE);
        BOOST_CHECK_EQUAL(result.last_failed_block, newTip->GetBlockHash());
        BOOST_CHECK(result.last_scanned_block.IsNull());
        BOOST_CHECK(!result.last_scanned_height);
        BOOST_CHECK_EQUAL(GetBalance(wallet).m_mine_immature, 0);
    }
}